

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::instrs<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  char cVar2;
  Ok local_121;
  Err local_120;
  Err *local_100;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> inst_1;
  Err local_a0;
  Err *local_80;
  Err *err;
  undefined1 local_68 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> inst;
  ParseModuleTypesCtx *ctx_local;
  
  while( true ) {
    while( true ) {
      instr<wasm::WATParser::ParseModuleTypesCtx>
                ((MaybeResult<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      if (bVar1) {
        MaybeResult<wasm::Ok>::MaybeResult
                  ((MaybeResult<wasm::Ok> *)local_68,
                   (MaybeResult<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        local_80 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_68);
        cVar2 = local_80 != (Err *)0x0;
        if ((bool)cVar2) {
          wasm::Err::Err(&local_a0,local_80);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
          wasm::Err::~Err(&local_a0);
        }
        MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_68);
        if (!(bool)cVar2) {
          cVar2 = '\x02';
        }
      }
      else {
        cVar2 = '\0';
      }
      MaybeResult<wasm::Ok>::~MaybeResult
                ((MaybeResult<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      if (cVar2 == '\0') break;
      if (cVar2 == '\x01') {
        return __return_storage_ptr__;
      }
    }
    foldedinstr<wasm::WATParser::ParseModuleTypesCtx>
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
    bVar1 = wasm::MaybeResult::operator_cast_to_bool
                      ((MaybeResult *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (bVar1) {
      MaybeResult<wasm::Ok>::MaybeResult
                ((MaybeResult<wasm::Ok> *)&err_1,
                 (MaybeResult<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      local_100 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
      cVar2 = local_100 != (Err *)0x0;
      if ((bool)cVar2) {
        wasm::Err::Err(&local_120,local_100);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_120);
        wasm::Err::~Err(&local_120);
      }
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
      if (!(bool)cVar2) {
        cVar2 = '\x02';
      }
    }
    else {
      cVar2 = '\0';
    }
    MaybeResult<wasm::Ok>::~MaybeResult
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (cVar2 == '\0') break;
    if (cVar2 == '\x01') {
      return __return_storage_ptr__;
    }
  }
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_121);
  return __return_storage_ptr__;
}

Assistant:

Result<> instrs(Ctx& ctx) {
  while (true) {
    if (auto inst = instr(ctx)) {
      CHECK_ERR(inst);
      continue;
    }
    if (auto inst = foldedinstr(ctx)) {
      CHECK_ERR(inst);
      continue;
    }
    break;
  }
  return Ok{};
}